

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

IndirOpnd * __thiscall
Func::GetConstantAddressIndirOpnd
          (Func *this,intptr_t address,Opnd *largeConstOpnd,AddrOpndKind kind,IRType type,
          OpCode loadOpCode)

{
  SList<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Type pRVar1;
  Opnd *this_01;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  Type *ppRVar6;
  AddrOpnd *pAVar7;
  IntConstOpnd *pIVar8;
  Var pvVar9;
  Instr *instr;
  Instr *pIVar10;
  IndirOpnd *this_02;
  undefined7 in_register_00000009;
  long lVar11;
  undefined7 in_register_00000081;
  AddrOpndKind kind_00;
  Type local_48;
  RegOpnd *addressRegOpnd;
  undefined4 local_38;
  undefined4 local_34;
  
  if (this->topFunc != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x7a4,"(this->GetTopFunc() == this)","this->GetTopFunc() == this");
    if (!bVar3) {
LAB_0040c592:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (this->canHoistConstantAddressLoad == true) {
    local_34 = (undefined4)CONCAT71(in_register_00000081,type);
    local_38 = (undefined4)CONCAT71(in_register_00000009,kind);
    this_00 = &this->constantAddressRegOpnd;
    local_48 = (Type)this_00;
    addressRegOpnd = (RegOpnd *)this_00;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    pRVar5 = (RegOpnd *)this_00;
    do {
      if (pRVar5 == (RegOpnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) goto LAB_0040c592;
        *puVar4 = 0;
        pRVar5 = addressRegOpnd;
      }
      pRVar5 = (RegOpnd *)
               ((SListNodeBase<Memory::ArenaAllocator> *)&(pRVar5->super_Opnd)._vptr_Opnd)->next;
      if (pRVar5 == local_48) {
        local_48 = IR::RegOpnd::New(TyUint64,this);
        instr = IR::Instr::New(loadOpCode,&local_48->super_Opnd,largeConstOpnd,this);
        SList<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  (this_00,&stack0xffffffffffffffb8);
        pIVar10 = this->lastConstantAddressRegLoadInstr;
        if (pIVar10 == (Instr *)0x0) {
          pIVar10 = GetFunctionEntryInsertionPoint(this);
          this->lastConstantAddressRegLoadInstr = instr;
        }
        IR::Instr::InsertBefore(pIVar10,instr);
        lVar11 = 0;
        kind_00 = (AddrOpndKind)local_38;
        goto LAB_0040c55a;
      }
      addressRegOpnd = pRVar5;
      ppRVar6 = SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&stack0xffffffffffffffb8);
      pRVar1 = *ppRVar6;
      pIVar10 = (pRVar1->m_sym->field_5).m_instrDef;
      if ((pRVar1->m_sym->field_0x18 & pIVar10 != (Instr *)0x0) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x7ae,"(regOpnd->m_sym->IsSingleDef())","regOpnd->m_sym->IsSingleDef()")
        ;
        if (!bVar3) goto LAB_0040c592;
        *puVar4 = 0;
        pIVar10 = (pRVar1->m_sym->field_5).m_instrDef;
      }
      bVar3 = IR::Opnd::IsAddrOpnd(pIVar10->m_src1);
      if ((!bVar3) &&
         (bVar3 = IR::Opnd::IsIntConstOpnd(((pRVar1->m_sym->field_5).m_instrDef)->m_src1), !bVar3))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x7af,
                           "(regOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd() || regOpnd->m_sym->m_instrDef->GetSrc1()->IsIntConstOpnd())"
                           ,
                           "regOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd() || regOpnd->m_sym->m_instrDef->GetSrc1()->IsIntConstOpnd()"
                          );
        if (!bVar3) goto LAB_0040c592;
        *puVar4 = 0;
      }
      bVar3 = IR::Opnd::IsAddrOpnd(((pRVar1->m_sym->field_5).m_instrDef)->m_src1);
      this_01 = ((pRVar1->m_sym->field_5).m_instrDef)->m_src1;
      if (bVar3) {
        pAVar7 = IR::Opnd::AsAddrOpnd(this_01);
        pvVar9 = pAVar7->m_address;
      }
      else {
        pIVar8 = IR::Opnd::AsIntConstOpnd(this_01);
        pvVar9 = (Var)(pIVar8->super_EncodableOpnd<long>).m_value;
      }
      lVar11 = address - (long)pvVar9;
      pRVar5 = addressRegOpnd;
    } while ((int)lVar11 != lVar11);
    ppRVar6 = SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&stack0xffffffffffffffb8);
    local_48 = *ppRVar6;
    kind_00 = (AddrOpndKind)local_38;
LAB_0040c55a:
    this_02 = IR::IndirOpnd::New(local_48,(int32)lVar11,(IRType)local_34,this,true);
    IR::IndirOpnd::SetAddrKind(this_02,kind_00,(void *)address);
  }
  else {
    this_02 = (IndirOpnd *)0x0;
  }
  return this_02;
}

Assistant:

IR::IndirOpnd * Func::GetConstantAddressIndirOpnd(intptr_t address, IR::Opnd * largeConstOpnd, IR::AddrOpndKind kind, IRType type, Js::OpCode loadOpCode)
{
    Assert(this->GetTopFunc() == this);
    if (!canHoistConstantAddressLoad)
    {
        // We can't hoist constant address load after lower, as we can't mark the sym as
        // live on back edge
        return nullptr;
    }
    int offset = 0;
    IR::RegOpnd ** foundRegOpnd = this->constantAddressRegOpnd.Find([address, &offset](IR::RegOpnd * regOpnd)
    {
        Assert(regOpnd->m_sym->IsSingleDef());
        Assert(regOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd() || regOpnd->m_sym->m_instrDef->GetSrc1()->IsIntConstOpnd());
        void * curr = regOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd() ?
                      regOpnd->m_sym->m_instrDef->GetSrc1()->AsAddrOpnd()->m_address :
                      (void *)regOpnd->m_sym->m_instrDef->GetSrc1()->AsIntConstOpnd()->GetValue();
        ptrdiff_t diff = (uintptr_t)address - (uintptr_t)curr;
        if (!Math::FitsInDWord(diff))
        {
            return false;
        }

        offset = (int)diff;
        return true;
    });

    IR::RegOpnd * addressRegOpnd;
    if (foundRegOpnd != nullptr)
    {
        addressRegOpnd = *foundRegOpnd;
    }
    else
    {
        Assert(offset == 0);
        addressRegOpnd = IR::RegOpnd::New(TyMachPtr, this);
        IR::Instr *const newInstr =
            IR::Instr::New(
            loadOpCode,
            addressRegOpnd,
            largeConstOpnd,
            this);
        this->constantAddressRegOpnd.Prepend(addressRegOpnd);

        IR::Instr * insertBeforeInstr = this->lastConstantAddressRegLoadInstr;
        if (insertBeforeInstr == nullptr)
        {
            insertBeforeInstr = this->GetFunctionEntryInsertionPoint();
            this->lastConstantAddressRegLoadInstr = newInstr;
        }
        insertBeforeInstr->InsertBefore(newInstr);
    }
    IR::IndirOpnd * indirOpnd =  IR::IndirOpnd::New(addressRegOpnd, offset, type, this, true);
#if DBG_DUMP
    // TODO: michhol make intptr_t
    indirOpnd->SetAddrKind(kind, (void*)address);
#endif
    return indirOpnd;
}